

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

QList<QPointer<QObject>_> * __thiscall
QPointerEvent::passiveGrabbers(QPointerEvent *this,QEventPoint *point)

{
  QPointingDevicePrivate *this_00;
  EventPointData *pEVar1;
  QDebug *o;
  QDebug *in_RDX;
  QPointerEvent *in_RSI;
  QList<QPointer<QObject>_> *in_RDI;
  long in_FS_OFFSET;
  EventPointData *persistentPoint;
  QList<QPointer<QObject>_> *this_01;
  int in_stack_ffffffffffffffcc;
  QEventPoint *in_stack_ffffffffffffffd8;
  QDebug in_stack_ffffffffffffffe0;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pointingDevice(in_RSI);
  this_00 = QPointingDevicePrivate::get((QPointingDevice *)0x34a6a3);
  QEventPoint::id((QEventPoint *)this_01);
  pEVar1 = QPointingDevicePrivate::queryPointById(this_00,in_stack_ffffffffffffffcc);
  if (pEVar1 == (EventPointData *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)0x0,(char *)this_00,(int)((ulong)this_01 >> 0x20),(char *)in_RDI);
    QMessageLogger::warning();
    o = QDebug::operator<<(in_RDX,(char *)in_stack_ffffffffffffffd8);
    QDebug::QDebug(&local_18,o);
    ::operator<<((QDebug *)in_stack_ffffffffffffffe0.stream,in_stack_ffffffffffffffd8);
    QDebug::~QDebug(&local_10);
    QDebug::~QDebug(&local_18);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffe0);
    memset(in_RDI,0,0x18);
    QList<QPointer<QObject>_>::QList((QList<QPointer<QObject>_> *)0x34a766);
  }
  else {
    QList<QPointer<QObject>_>::QList(this_01,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPointer<QObject> > QPointerEvent::passiveGrabbers(const QEventPoint &point) const
{
    Q_ASSERT(pointingDevice());
    auto persistentPoint = QPointingDevicePrivate::get(pointingDevice())->queryPointById(point.id());
    if (Q_UNLIKELY(!persistentPoint)) {
        qWarning() << "point is not in activePoints" << point;
        return {};
    }
    return persistentPoint->passiveGrabbers;
}